

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultCachedPhoto.h
# Opt level: O3

void __thiscall
TgBot::InlineQueryResultCachedPhoto::InlineQueryResultCachedPhoto
          (InlineQueryResultCachedPhoto *this)

{
  (this->super_InlineQueryResult).type._M_dataplus._M_p =
       (pointer)&(this->super_InlineQueryResult).type.field_2;
  (this->super_InlineQueryResult).type._M_string_length = 0;
  (this->super_InlineQueryResult).type.field_2._M_local_buf[0] = '\0';
  (this->super_InlineQueryResult).id._M_dataplus._M_p =
       (pointer)&(this->super_InlineQueryResult).id.field_2;
  (this->super_InlineQueryResult).id._M_string_length = 0;
  (this->super_InlineQueryResult).id.field_2._M_local_buf[0] = '\0';
  (this->super_InlineQueryResult).title._M_dataplus._M_p =
       (pointer)&(this->super_InlineQueryResult).title.field_2;
  (this->super_InlineQueryResult).title._M_string_length = 0;
  (this->super_InlineQueryResult).title.field_2._M_local_buf[0] = '\0';
  (this->super_InlineQueryResult).caption._M_dataplus._M_p =
       (pointer)&(this->super_InlineQueryResult).caption.field_2;
  (this->super_InlineQueryResult).caption._M_string_length = 0;
  (this->super_InlineQueryResult).caption.field_2._M_local_buf[0] = '\0';
  (this->super_InlineQueryResult).replyMarkup.
  super___shared_ptr<TgBot::InlineKeyboardMarkup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_InlineQueryResult).replyMarkup.
  super___shared_ptr<TgBot::InlineKeyboardMarkup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_InlineQueryResult).inputMessageContent.
  super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_InlineQueryResult).inputMessageContent.
  super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultCachedPhoto_002a5f30;
  (this->photoFileId)._M_dataplus._M_p = (pointer)&(this->photoFileId).field_2;
  (this->photoFileId)._M_string_length = 0;
  (this->photoFileId).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_InlineQueryResult).type);
  return;
}

Assistant:

InlineQueryResultCachedPhoto() {
        this->type = TYPE;
    }